

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseExpressionWithPrecedenceCast(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  uint uVar3;
  SyntaxToken *pSVar4;
  ulong uVar5;
  IndexType IVar6;
  ostream *poVar7;
  Backtracker BT;
  Backtracker local_80;
  
  pSVar4 = peek(this,1);
  if (pSVar4->syntaxK_ == Keyword_ExtGNU___extension__) {
    IVar6 = consume(this);
    bVar1 = parseExpressionWithPrecedenceCast(this,expr);
    if (bVar1) {
      if (*expr != (ExpressionSyntax *)0x0) {
        ((*expr)->super_MIXIN_GNUExtensionFlag).extKwTkIdx_ = IVar6;
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x478);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"invalid expression",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    return false;
  }
  if (pSVar4->syntaxK_ != OpenParenToken) {
    bVar1 = parseExpressionWithPrecedenceUnary(this,expr);
    return bVar1;
  }
  pSVar4 = peek(this,2);
  uVar5 = (ulong)pSVar4->syntaxK_;
  if (uVar5 < 0x3e) {
    if ((0x3cb5854600000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_002c1b18;
    if (uVar5 == 6) {
      Backtracker::Backtracker(&local_80,this,0);
      bVar1 = parseCompoundLiteralOrCastExpression_AtFirst(this,expr);
      if (bVar1) {
        SVar2 = SyntaxNode::kind(&(*expr)->super_SyntaxNode);
        if (SVar2 == CastExpression) {
          maybeAmbiguateCastExpression(this,expr);
        }
        Backtracker::~Backtracker(&local_80);
        return true;
      }
      Backtracker::backtrack(&local_80);
      Backtracker::~Backtracker(&local_80);
      goto LAB_002c1bee;
    }
  }
  uVar3 = pSVar4->syntaxK_ - 0x66;
  if ((0x21 < uVar3) || ((0x201001857U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
LAB_002c1bee:
    bVar1 = parseExpressionWithPrecedenceUnary(this,expr);
    return bVar1;
  }
LAB_002c1b18:
  bVar1 = parseCompoundLiteralOrCastExpression_AtFirst(this,expr);
  return bVar1;
}

Assistant:

bool Parser::parseExpressionWithPrecedenceCast(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            // cast-expression -> unary-expression ->* `(' expression `)'
            //                  | `(' type-name `)' cast-expression
            switch (peek(2).kind()) {
                // type-name ->* type-qualifier
                case SyntaxKind::Keyword_const:
                case SyntaxKind::Keyword_volatile:
                case SyntaxKind::Keyword_restrict:
                case SyntaxKind::Keyword__Atomic:

                // type-name ->* alignment-specifier
                case SyntaxKind::Keyword__Alignas:

                // type-name ->* GNU-typeof-specifier ->
                case SyntaxKind::Keyword_ExtGNU___typeof__:

                // // type-name ->* type-specifier
                case SyntaxKind::Keyword_void:
                case SyntaxKind::Keyword_char:
                case SyntaxKind::Keyword_short:
                case SyntaxKind::Keyword_int:
                case SyntaxKind::Keyword_long:
                case SyntaxKind::Keyword_float:
                case SyntaxKind::Keyword_double:
                case SyntaxKind::Keyword__Bool:
                case SyntaxKind::Keyword__Complex:
                case SyntaxKind::Keyword_signed:
                case SyntaxKind::Keyword_unsigned:
                case SyntaxKind::Keyword_Ext_char16_t:
                case SyntaxKind::Keyword_Ext_char32_t:
                case SyntaxKind::Keyword_Ext_wchar_t:
                case SyntaxKind::Keyword_struct:
                case SyntaxKind::Keyword_union:
                case SyntaxKind::Keyword_enum:
                case SyntaxKind::Keyword_ExtGNU___complex__:
                    return parseCompoundLiteralOrCastExpression_AtFirst(expr);

                // type-name ->* typedef-name -> identifier
                // expression ->* identifier
                case SyntaxKind::IdentifierToken: {
                    Backtracker BT(this);
                    if (parseCompoundLiteralOrCastExpression_AtFirst(expr)) {
                        if (expr->kind() == SyntaxKind::CastExpression)
                            maybeAmbiguateCastExpression(expr);
                        return true;
                    }
                    BT.backtrack();
                    [[fallthrough]];
                }

                default:
                    return parseExpressionWithPrecedenceUnary(expr);
            }
        }

        case SyntaxKind::Keyword_ExtGNU___extension__: {
            auto extKwTkIdx = consume();
            if (!parseExpressionWithPrecedenceCast(expr))
                return false;
            PSY_ASSERT_3(expr, return false, "invalid expression");
            expr->extKwTkIdx_ = extKwTkIdx;
            return true;
        }

        default:
            return parseExpressionWithPrecedenceUnary(expr);
    }
}